

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O2

string * __thiscall
duckdb::CSVFileHandle::ReadLine_abi_cxx11_(string *__return_storage_ptr__,CSVFileHandle *this)

{
  byte bVar1;
  bool bVar2;
  idx_t iVar3;
  pointer pFVar4;
  pointer this_00;
  BinderException *this_01;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *this_02;
  char buffer [1];
  allocator local_49;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = 0;
  while( true ) {
    iVar3 = Read(this,buffer,1);
    if (iVar3 == 0) {
      return __return_storage_ptr__;
    }
    if ((bool)(buffer[0] != '\n' & bVar1)) break;
    if (buffer[0] == '\n') {
      return __return_storage_ptr__;
    }
    if (buffer[0] == '\r') {
      bVar1 = 1;
    }
    else {
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  this_02 = &this->file_handle;
  pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_02);
  bVar2 = FileHandle::CanSeek(pFVar4);
  if (bVar2) {
    pFVar4 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator->(this_02);
    this_00 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
              operator->(this_02);
    iVar3 = FileHandle::SeekPosition(this_00);
    FileHandle::Seek(pFVar4,iVar3 - 1);
    return __return_storage_ptr__;
  }
  this_01 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,
             "Carriage return newlines not supported when reading CSV files in which we cannot seek"
             ,&local_49);
  BinderException::BinderException(this_01,&local_48);
  __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string CSVFileHandle::ReadLine() {
	bool carriage_return = false;
	string result;
	char buffer[1];
	while (true) {
		idx_t bytes_read = Read(buffer, 1);
		if (bytes_read == 0) {
			return result;
		}
		if (carriage_return) {
			if (buffer[0] != '\n') {
				if (!file_handle->CanSeek()) {
					throw BinderException(
					    "Carriage return newlines not supported when reading CSV files in which we cannot seek");
				}
				file_handle->Seek(file_handle->SeekPosition() - 1);
				return result;
			}
		}
		if (buffer[0] == '\n') {
			return result;
		}
		if (buffer[0] != '\r') {
			result += buffer[0];
		} else {
			carriage_return = true;
		}
	}
}